

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseBuilder::runPasses(BaseBuilder *this)

{
  uint uVar1;
  ErrorHandler *errorHandler;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  Error err;
  Error EVar5;
  char *message;
  long lVar6;
  bool bVar7;
  PostponedErrorHandler postponed;
  ErrorHandler local_e0;
  undefined8 local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  char local_b8 [136];
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar5 = 5;
  }
  else if (*(int *)&this->field_0x170 == 0) {
    EVar5 = 0;
  }
  else {
    errorHandler = (this->super_BaseEmitter)._errorHandler;
    ErrorHandler::ErrorHandler(&local_e0);
    local_e0._vptr_ErrorHandler = (_func_int **)&PTR__PostponedErrorHandler_00177078;
    uStack_d0 = 0;
    local_d8 = 0x20;
    local_c8 = 0x87;
    pcStack_c0 = local_b8;
    local_b8[0] = '\0';
    BaseEmitter::setErrorHandler(&this->super_BaseEmitter,&local_e0);
    uVar1 = *(uint *)&this->field_0x170;
    err = 0;
    if ((ulong)uVar1 != 0) {
      lVar2 = *(long *)&this->_passes;
      lVar6 = 0;
      do {
        plVar3 = *(long **)(lVar2 + lVar6);
        Zone::reset(&this->_passZone,kSoft);
        err = (**(code **)(*plVar3 + 0x10))
                        (plVar3,&this->_passZone,(this->super_BaseEmitter)._logger);
        if (err != 0) break;
        bVar7 = (ulong)uVar1 * 8 + -8 != lVar6;
        lVar6 = lVar6 + 8;
      } while (bVar7);
    }
    Zone::reset(&this->_passZone,kSoft);
    BaseEmitter::setErrorHandler(&this->super_BaseEmitter,errorHandler);
    EVar5 = 0;
    if (err != 0) {
      message = (char *)((long)&local_d8 + 1);
      uVar4 = local_d8 & 0xff;
      if (0x1e < (local_d8 & 0xff)) {
        message = pcStack_c0;
        uVar4 = uStack_d0;
      }
      if (uVar4 == 0) {
        message = (char *)0x0;
      }
      EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,err,message);
    }
    local_e0._vptr_ErrorHandler = (_func_int **)&PTR__PostponedErrorHandler_00177078;
    String::reset((String *)&local_d8);
    ErrorHandler::~ErrorHandler(&local_e0);
  }
  return EVar5;
}

Assistant:

Error BaseBuilder::runPasses() {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (_passes.empty())
    return kErrorOk;

  ErrorHandler* prev = errorHandler();
  PostponedErrorHandler postponed;

  Error err = kErrorOk;
  setErrorHandler(&postponed);

  for (Pass* pass : _passes) {
    _passZone.reset();
    err = pass->run(&_passZone, _logger);
    if (err)
      break;
  }
  _passZone.reset();
  setErrorHandler(prev);

  if (ASMJIT_UNLIKELY(err))
    return reportError(err, !postponed._message.empty() ? postponed._message.data() : nullptr);

  return kErrorOk;
}